

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int is_afio_large(char *h,size_t len)

{
  int iVar1;
  size_t len_local;
  char *h_local;
  
  if (len < 0x74) {
    h_local._4_4_ = 0;
  }
  else if ((((h[0x1e] == 'm') && (h[0x55] == 'n')) && (h[0x62] == 's')) && (h[0x73] == ':')) {
    iVar1 = is_hex(h + 6,0x18);
    if (iVar1 == 0) {
      h_local._4_4_ = 0;
    }
    else {
      iVar1 = is_hex(h + 0x1f,0x36);
      if (iVar1 == 0) {
        h_local._4_4_ = 0;
      }
      else {
        iVar1 = is_hex(h + 0x56,0xc);
        if (iVar1 == 0) {
          h_local._4_4_ = 0;
        }
        else {
          iVar1 = is_hex(h + 99,0x10);
          if (iVar1 == 0) {
            h_local._4_4_ = 0;
          }
          else {
            h_local._4_4_ = 1;
          }
        }
      }
    }
  }
  else {
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

static int
is_afio_large(const char *h, size_t len)
{
	if (len < afiol_header_size)
		return (0);
	if (h[afiol_ino_m_offset] != 'm'
	    || h[afiol_mtime_n_offset] != 'n'
	    || h[afiol_xsize_s_offset] != 's'
	    || h[afiol_filesize_c_offset] != ':')
		return (0);
	if (!is_hex(h + afiol_dev_offset, afiol_ino_m_offset - afiol_dev_offset))
		return (0);
	if (!is_hex(h + afiol_mode_offset, afiol_mtime_n_offset - afiol_mode_offset))
		return (0);
	if (!is_hex(h + afiol_namesize_offset, afiol_xsize_s_offset - afiol_namesize_offset))
		return (0);
	if (!is_hex(h + afiol_filesize_offset, afiol_filesize_size))
		return (0);
	return (1);
}